

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  ReusableStringStream rss;
  string name;
  ReusableStringStream RStack_128;
  string local_110;
  string local_f0 [8];
  long local_e8;
  TestCase local_d0;
  
  std::__cxx11::string::string(local_f0,(string *)testCase);
  if (local_e8 == 0) {
    ReusableStringStream::ReusableStringStream(&RStack_128);
    std::operator<<(RStack_128.m_oss,"Anonymous test case ");
    this->m_unnamedCount = this->m_unnamedCount + 1;
    ReusableStringStream::operator<<(&RStack_128,&this->m_unnamedCount);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_d0,testCase,&local_110);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_d0);
    TestCase::~TestCase(&local_d0);
    std::__cxx11::string::~string((string *)&local_110);
    ReusableStringStream::~ReusableStringStream(&RStack_128);
  }
  else {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functions,testCase);
  }
  std::__cxx11::string::~string(local_f0);
  return;
}

Assistant:

void TestRegistry::registerTest( TestCase const& testCase ) {
        std::string name = testCase.getTestCaseInfo().name;
        if( name.empty() ) {
            ReusableStringStream rss;
            rss << "Anonymous test case " << ++m_unnamedCount;
            return registerTest( testCase.withName( rss.str() ) );
        }
        m_functions.push_back( testCase );
    }